

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::ParseDeep(XMLElement *this,char *p,StrPair *strPair)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RDI;
  char *in_stack_00000020;
  XMLElement *in_stack_00000028;
  StrPair *in_stack_000000a8;
  char *in_stack_000000b0;
  XMLNode *in_stack_000000b8;
  StrPair *in_stack_fffffffffffffff8;
  
  pcVar3 = in_RDI;
  pcVar2 = XMLUtil::SkipWhiteSpace((char *)0x2c5056);
  if (*pcVar2 == '/') {
    in_RDI[0x58] = '\x02';
    in_RDI[0x59] = '\0';
    in_RDI[0x5a] = '\0';
    in_RDI[0x5b] = '\0';
  }
  StrPair::ParseName(in_stack_fffffffffffffff8,pcVar3);
  bVar1 = StrPair::Empty((StrPair *)(in_RDI + 0x18));
  if (bVar1) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = ParseAttributes(in_stack_00000028,in_stack_00000020);
    if (((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) && (*(int *)(in_RDI + 0x58) == 0)) {
      pcVar3 = XMLNode::ParseDeep(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
    }
  }
  return pcVar3;
}

Assistant:

char* XMLElement::ParseDeep( char* p, StrPair* strPair )
{
    // Read the element name.
    p = XMLUtil::SkipWhiteSpace( p );

    // The closing element is the </element> form. It is
    // parsed just like a regular element then deleted from
    // the DOM.
    if ( *p == '/' ) {
        _closingType = CLOSING;
        ++p;
    }

    p = _value.ParseName( p );
    if ( _value.Empty() ) {
        return 0;
    }

    p = ParseAttributes( p );
    if ( !p || !*p || _closingType ) {
        return p;
    }

    p = XMLNode::ParseDeep( p, strPair );
    return p;
}